

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionDirWrapper.cpp
# Opt level: O3

void * __thiscall
ExceptionEntryWrapper::getFieldPtr(ExceptionEntryWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  
  iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
              super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xc])();
    if (iVar1 == 1) {
      if (fieldId == 2) {
        pvVar2 = (void *)((long)pvVar2 + 8);
      }
      else if (fieldId == 1) {
        pvVar2 = (void *)((long)pvVar2 + 4);
      }
    }
    else {
      iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
                super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xc])();
      if (iVar1 == 2) {
        iVar1 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
                  super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
        pvVar2 = (void *)((long)pvVar2 + (ulong)(fieldId == 1 && iVar1 == 0x40) * 4);
      }
    }
  }
  return pvVar2;
}

Assistant:

void* ExceptionEntryWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    void *ptr = this->getPtr();
    if (!ptr) return nullptr;
    
    if (this->m_Exe->getArch() == Executable::ARCH_INTEL) {
        IMAGE_IA64_RUNTIME_FUNCTION_ENTRY* exc = (IMAGE_IA64_RUNTIME_FUNCTION_ENTRY*) ptr;
        if (!exc) return NULL;

        switch (fieldId) {
            case BEGIN_ADDR : return &exc->BeginAddress;
            case END_ADDR : return &exc->EndAddress;
            case UNWIND_INFO_ADDR : return &exc->UnwindInfoAddress;
        }
    }
    else if (this->m_Exe->getArch() == Executable::ARCH_ARM && this->m_Exe->getBitMode() == 64) {
        ARM_EXCEPT_RECORD *rec = (ARM_EXCEPT_RECORD*) ptr;
        if (!rec) return NULL;
        
        switch (fieldId) {
            case ARM_EXCEPT_START : return &rec->Start;
            case ARM_EXCEPT_XDATA : return &rec->Xdata;
        }
    }
    return ptr;
}